

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O3

CfgNode * CFGReader::haltNode(CFG *cfg)

{
  CfgNode *this;
  
  this = cfg->m_exitNode;
  if (this == (CfgNode *)0x0) {
    this = (CfgNode *)operator_new(0x18);
    CfgNode::CfgNode(this,CFG_HALT);
    CFG::addNode(cfg,this);
  }
  return this;
}

Assistant:

CFG* CFGReader::cfg(Addr addr) const {
	std::map<Addr, CFG*>::const_iterator it = m_cfgs.find(addr);
	return it != m_cfgs.end() ? it->second : 0;
}